

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long in_RDI;
  U32 mls;
  size_t in_stack_000000a0;
  void *in_stack_000000a8;
  U32 *in_stack_000000b0;
  seqStore_t *in_stack_000000b8;
  ZSTD_matchState_t *in_stack_000000c0;
  size_t local_8;
  
  if (*(long *)(in_RDI + 0xf8) != 0) {
    switch(*(undefined4 *)(in_RDI + 0x110)) {
    default:
      local_8 = ZSTD_compressBlock_fast_dictMatchState_4_0
                          (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                           in_stack_000000a0);
      break;
    case 5:
      local_8 = ZSTD_compressBlock_fast_dictMatchState_5_0
                          (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                           in_stack_000000a0);
      break;
    case 6:
      local_8 = ZSTD_compressBlock_fast_dictMatchState_6_0
                          (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                           in_stack_000000a0);
      break;
    case 7:
      local_8 = ZSTD_compressBlock_fast_dictMatchState_7_0
                          (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                           in_stack_000000a0);
    }
    return local_8;
  }
  __assert_fail("ms->dictMatchState != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x724e,
                "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}